

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

xml_node<char> * __thiscall ki::dml::Record::as_xml(Record *this,xml_document<char> *doc)

{
  int iVar1;
  xml_node<char> *this_00;
  undefined4 extraout_var;
  pointer ppFVar2;
  
  this_00 = rapidxml::memory_pool<char>::allocate_node
                      (&doc->super_memory_pool<char>,node_element,"RECORD",(char *)0x0,0,0);
  for (ppFVar2 = (this->m_fields).
                 super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppFVar2 !=
      (this->m_fields).
      super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    iVar1 = (*((*ppFVar2)->super_Serializable)._vptr_Serializable[6])(*ppFVar2,doc);
    rapidxml::xml_node<char>::append_node(this_00,(xml_node<char> *)CONCAT44(extraout_var,iVar1));
  }
  return this_00;
}

Assistant:

rapidxml::xml_node<> *Record::as_xml(rapidxml::xml_document<> &doc) const
	{
		auto *node = doc.allocate_node(rapidxml::node_type::node_element, "RECORD");
		for (auto it = m_fields.begin(); it != m_fields.end(); ++it)
			node->append_node((*it)->as_xml(doc));
		return node;
	}